

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

bool xercesc_4_0::XMLUri::isValidURI(XMLUri *baseURI,XMLCh *uriStr,bool bAllowSpaces)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  XMLSize_t XVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  XMLCh *src;
  ulong uVar13;
  XMLSize_t local_40;
  XMLUri *local_38;
  
  do {
    src = uriStr;
    uriStr = src + 1;
  } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)*src] < '\0');
  XVar8 = XMLString::stringLen(src);
  uVar13 = XVar8 + 1;
  do {
    if (uVar13 == 1) {
      return baseURI != (XMLUri *)0x0;
    }
    lVar1 = uVar13 - 2;
    uVar13 = uVar13 - 1;
  } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)src[lVar1]] < '\0');
  local_40 = 0;
  local_38 = baseURI;
  iVar4 = XMLString::indexOf(src,L':');
  iVar5 = XMLString::indexOf(src,L'/');
  iVar6 = XMLString::indexOf(src,L'?');
  iVar7 = XMLString::indexOf(src,L'#');
  if (iVar4 < 1) {
    if (iVar4 == 0) {
      return false;
    }
  }
  else if (((iVar4 <= iVar5 || iVar5 == -1) && (iVar4 <= iVar6 || iVar6 == -1)) &&
          (iVar4 <= iVar7 || iVar7 == -1)) {
    bVar2 = processScheme(src,&local_40);
    if (!bVar2) {
      return false;
    }
    if (uVar13 - local_40 == 1) {
      return false;
    }
    if (src[local_40 + 1] == L'#') {
      return false;
    }
    uVar10 = local_40 + 1;
    bVar2 = true;
    goto LAB_0026b1e1;
  }
  bVar2 = false;
  if (local_38 == (XMLUri *)0x0 && iVar7 != 0) {
    return false;
  }
  uVar10 = 0;
LAB_0026b1e1:
  if ((uVar10 + 1 < uVar13) && (bVar3 = XMLString::startsWith(src + uVar10,L"//"), bVar3)) {
    uVar11 = uVar10 + 2;
    uVar12 = uVar11;
    uVar9 = uVar11;
    if (uVar11 < uVar13) {
      uVar9 = uVar13;
    }
    while ((uVar10 = uVar9, uVar12 < uVar13 &&
           ((0x3f < (ulong)(ushort)src[uVar12] ||
            (uVar10 = uVar12, (0x8000800800000000U >> ((ulong)(ushort)src[uVar12] & 0x3f) & 1) == 0)
            )))) {
      uVar12 = uVar12 + 1;
    }
    if ((uVar11 <= uVar10 && uVar10 - uVar11 != 0) &&
       (bVar3 = processAuthority(src + uVar11,uVar10 - uVar11), !bVar3)) {
      return false;
    }
  }
  if ((uVar10 < uVar13) &&
     (bVar2 = processPath(src + uVar10,uVar13 - uVar10,bVar2,bAllowSpaces), !bVar2)) {
    return false;
  }
  return true;
}

Assistant:

bool XMLUri::isValidURI(const XMLUri* const baseURI
                       , const XMLCh* const uriStr
                       , bool bAllowSpaces/*=false*/)
{
    // get a trimmed version of uriStr
    // uriStr will NO LONGER be used in this function.
    const XMLCh* trimmedUriSpec = uriStr;

    while (XMLChar1_0::isWhitespace(*trimmedUriSpec))
        trimmedUriSpec++;

    XMLSize_t trimmedUriSpecLen = XMLString::stringLen(trimmedUriSpec);

    while (trimmedUriSpecLen) {
        if (XMLChar1_0::isWhitespace(trimmedUriSpec[trimmedUriSpecLen-1]))
            trimmedUriSpecLen--;
        else
            break;
    }

    if (trimmedUriSpecLen == 0)
    {
        if (!baseURI)
            return false;
        else
            return true;
    }

    XMLSize_t index = 0;
    bool foundScheme = false;

    // Check for scheme, which must be before `/', '?' or '#'.
    int colonIdx = XMLString::indexOf(trimmedUriSpec, chColon);
    int slashIdx = XMLString::indexOf(trimmedUriSpec, chForwardSlash);
    int queryIdx = XMLString::indexOf(trimmedUriSpec, chQuestion);
    int fragmentIdx = XMLString::indexOf(trimmedUriSpec, chPound);

    if ((colonIdx <= 0) ||
        (colonIdx > slashIdx && slashIdx != -1) ||
        (colonIdx > queryIdx && queryIdx != -1) ||
        (colonIdx > fragmentIdx && fragmentIdx != -1))
    {
        // A standalone base is a valid URI according to spec
        if (colonIdx == 0 || (!baseURI && fragmentIdx != 0))
            return false;
    }
    else
    {
        if (!processScheme(trimmedUriSpec, index))
            return false;
        foundScheme = true;
        ++index;
    }

    // It's an error if we stop here
    if (index == trimmedUriSpecLen || (foundScheme && (trimmedUriSpec[index] == chPound)))
        return false;

	// two slashes means generic URI syntax, so we get the authority
    const XMLCh* authUriSpec = trimmedUriSpec +  index;
    if (((index+1) < trimmedUriSpecLen) &&
        XMLString::startsWith(authUriSpec, DOUBLE_SLASH))
    {
        index += 2;
        XMLSize_t startPos = index;

        // get authority - everything up to path, query or fragment
        XMLCh testChar;
        while (index < trimmedUriSpecLen)
        {
            testChar = trimmedUriSpec[index];
            if (testChar == chForwardSlash ||
                testChar == chQuestion     ||
                testChar == chPound         )
            {
                break;
            }

            index++;
        }

        // if we found authority, parse it out, otherwise we set the
        // host to empty string
        if (index > startPos)
        {
            if (!processAuthority(trimmedUriSpec + startPos, index - startPos))
                return false;
        }
    }

    // we need to check if index has exceed the lenght or not
    if (index < trimmedUriSpecLen)
    {
	    if (!processPath(trimmedUriSpec + index, trimmedUriSpecLen - index, foundScheme, bAllowSpaces))
            return false;
    }

    return true;
}